

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

char __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::FractionalDigitGenerator::GetOneDigit
          (FractionalDigitGenerator *this)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  long *plVar6;
  uint uVar7;
  pointer puVar8;
  size_t sVar9;
  size_t sVar10;
  FractionalDigitGenerator FStack_60;
  
  sVar10 = this->after_chunk_index_;
  if (sVar10 == 0) {
    uVar5 = 0;
  }
  else {
    puVar8 = (this->data_).ptr_;
    uVar2 = (this->data_).len_;
    uVar1 = sVar10 - 1;
    uVar5 = 0;
    sVar9 = sVar10;
    do {
      if (uVar2 <= uVar1) {
        _GLOBAL__N_1::FractionalDigitGenerator::GetOneDigit();
        goto LAB_004d9860;
      }
      uVar5 = uVar5 + (ulong)puVar8[sVar9 - 1] * 10;
      puVar8[sVar9 - 1] = (uint)uVar5;
      sVar9 = sVar9 - 1;
      uVar5 = uVar5 >> 0x20;
    } while (sVar9 != 0);
    if ((this->data_).len_ <= uVar1) {
LAB_004d9860:
      _GLOBAL__N_1::FractionalDigitGenerator::GetOneDigit();
      FStack_60._0_8_ = *(undefined8 *)puVar8;
      FStack_60.after_chunk_index_ = *(size_t *)(puVar8 + 2);
      FStack_60.data_.ptr_ = *(pointer *)(puVar8 + 4);
      FStack_60.data_.len_ = *(size_type *)(puVar8 + 6);
      plVar6 = *(long **)this;
      if (plVar6[1] != 0) {
        do {
          plVar6 = (long *)this->after_chunk_index_;
          if (*plVar6 == 0) break;
          cVar3 = FStack_60.next_digit_;
          uVar7 = (uint)FStack_60.next_digit_;
          if ((FStack_60.next_digit_ == '\0') && (FStack_60.after_chunk_index_ == 0)) break;
          cVar4 = GetOneDigit(&FStack_60);
          FStack_60.next_digit_ = cVar4;
          sVar10 = 0;
          while (cVar4 == '\t') {
            sVar10 = sVar10 + 1;
            cVar4 = GetOneDigit(&FStack_60);
            FStack_60.next_digit_ = cVar4;
          }
          uVar5 = sVar10 + 1;
          uVar1 = *(ulong *)this->after_chunk_index_;
          if (uVar5 < uVar1) {
            FormatSinkImpl::Append(*(FormatSinkImpl **)(*(long *)this + 0x18),1,cVar3 + '0');
            FormatSinkImpl::Append(*(FormatSinkImpl **)(*(long *)this + 0x18),sVar10,'9');
            plVar6 = (long *)this->after_chunk_index_;
            *plVar6 = *plVar6 - uVar5;
          }
          else {
            if (uVar5 <= uVar1) {
              if (((FStack_60.next_digit_ < '\x06') &&
                  (FStack_60.next_digit_ != '\x05' || FStack_60.after_chunk_index_ == 0)) &&
                 ((FStack_60.after_chunk_index_ != 0 || FStack_60.next_digit_ != '\x05' ||
                  ((uVar7 & 0x80000001) != 1 && sVar10 == 0)))) {
                FormatSinkImpl::Append(*(FormatSinkImpl **)(*(long *)this + 0x18),1,cVar3 + '0');
                FormatSinkImpl::Append
                          (*(FormatSinkImpl **)(*(long *)this + 0x18),
                           *(long *)this->after_chunk_index_ - 1,'9');
                plVar6 = (long *)this->after_chunk_index_;
                *plVar6 = 0;
                goto LAB_004d995e;
              }
            }
            FormatSinkImpl::Append(*(FormatSinkImpl **)(*(long *)this + 0x18),1,cVar3 + '1');
            plVar6 = (long *)this->after_chunk_index_;
            *plVar6 = *plVar6 + -1;
          }
LAB_004d995e:
        } while (uVar5 < uVar1);
      }
      return (char)plVar6;
    }
    if ((this->data_).ptr_[sVar10 - 1] == 0) {
      this->after_chunk_index_ = uVar1;
    }
  }
  return (char)uVar5;
}

Assistant:

char GetOneDigit() {
    if (!after_chunk_index_)
      return 0;

    char carry = 0;
    for (size_t i = after_chunk_index_; i > 0; --i) {
      carry = MultiplyBy10WithCarry(&data_[i - 1], carry);
    }
    // If the lowest chunk is now empty, remove it from view.
    if (data_[after_chunk_index_ - 1] == 0)
      --after_chunk_index_;
    return carry;
  }